

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function-c.cpp
# Opt level: O3

duckdb_state
duckdb_add_scalar_function_to_set(duckdb_scalar_function_set set,duckdb_scalar_function function)

{
  scalar_function_t *this;
  duckdb_state dVar1;
  long lVar2;
  duckdb_scalar_function p_Var3;
  bind_scalar_function_t *pp_Var4;
  byte bVar5;
  ScalarFunction local_150;
  
  bVar5 = 0;
  dVar1 = DuckDBError;
  if (function != (duckdb_scalar_function)0x0 && set != (duckdb_scalar_function_set)0x0) {
    duckdb::SimpleFunction::SimpleFunction((SimpleFunction *)&local_150,(SimpleFunction *)function);
    local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__BaseScalarFunction_0243ff60;
    duckdb::LogicalType::LogicalType
              (&local_150.super_BaseScalarFunction.return_type,(LogicalType *)(function + 0x90));
    local_150.super_BaseScalarFunction._168_4_ = *(undefined4 *)(function + 0xa8);
    local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__ScalarFunction_02433f30;
    this = &local_150.function;
    std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
              (this,(function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     *)(function + 0xb0));
    p_Var3 = function + 0xd0;
    pp_Var4 = &local_150.bind;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      *pp_Var4 = *(bind_scalar_function_t *)p_Var3;
      p_Var3 = p_Var3 + (ulong)bVar5 * -0x10 + 8;
      pp_Var4 = pp_Var4 + (ulong)bVar5 * -2 + 1;
    }
    local_150.function_info.internal.
    super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(function + 0x118);
    local_150.function_info.internal.
    super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(function + 0x120);
    if (local_150.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_150.function_info.internal.
         super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_150.function_info.internal.
              super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_150.function_info.internal.
         super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_150.function_info.internal.
              super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_use_count + 1;
      }
    }
    std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
    emplace_back<duckdb::ScalarFunction>
              ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
               (set + 0x20),&local_150);
    local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__ScalarFunction_02433f30;
    if (local_150.function_info.internal.
        super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_150.function_info.internal.
                 super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_150.function.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_150.function.super__Function_base._M_manager)
                ((_Any_data *)this,(_Any_data *)this,__destroy_functor);
    }
    duckdb::BaseScalarFunction::~BaseScalarFunction(&local_150.super_BaseScalarFunction);
    dVar1 = DuckDBSuccess;
  }
  return dVar1;
}

Assistant:

duckdb_state duckdb_add_scalar_function_to_set(duckdb_scalar_function_set set, duckdb_scalar_function function) {
	if (!set || !function) {
		return DuckDBError;
	}
	auto &scalar_function_set = GetCScalarFunctionSet(set);
	auto &scalar_function = GetCScalarFunction(function);
	scalar_function_set.AddFunction(scalar_function);
	return DuckDBSuccess;
}